

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

string * __thiscall
mocker::ir::Interpreter::deleteComments
          (string *__return_storage_ptr__,Interpreter *this,string *source)

{
  char *pcVar1;
  char cVar2;
  Iter IVar3;
  pointer pcVar4;
  Interpreter *this_00;
  Iter iter;
  pointer local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (Interpreter *)source;
  std::__cxx11::string::push_back((char)source);
  pcVar4 = (source->_M_dataplus)._M_p;
  iter._M_current = pcVar4;
  while (iter._M_current != pcVar4 + source->_M_string_length) {
    cVar2 = *iter._M_current;
    if (cVar2 == '\"') {
      IVar3 = readStringLiteral(this_00,iter,(Iter)(pcVar4 + source->_M_string_length));
      local_50 = (pointer)&stack0xffffffffffffffc0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&stack0xffffffffffffffb0,iter._M_current,IVar3._M_current);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_00 = (Interpreter *)&stack0xffffffffffffffb0;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      iter = IVar3;
    }
    else if (cVar2 == ';') {
      while (cVar2 != '\n') {
        pcVar1 = iter._M_current + 1;
        iter._M_current = iter._M_current + 1;
        cVar2 = *pcVar1;
      }
    }
    else {
      this_00 = (Interpreter *)__return_storage_ptr__;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      iter._M_current = iter._M_current + 1;
    }
    pcVar4 = (source->_M_dataplus)._M_p;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::deleteComments(std::string source) const {
  std::string res;

  source.push_back('\n');
  auto iter = source.cbegin();
  while (iter != source.end()) {
    if (*iter == '\"') {
      auto strEnd = readStringLiteral(iter, source.end());
      res += std::string(iter, strEnd);
      iter = strEnd;
      continue;
    }
    if (*iter != ';') {
      res.push_back(*iter);
      ++iter;
      continue;
    }
    while (*iter != '\n')
      ++iter;
  }

  return res;
}